

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O1

OperatorResultType __thiscall
duckdb::CrossProductExecutor::Execute(CrossProductExecutor *this,DataChunk *input,DataChunk *output)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  OperatorResultType OVar4;
  reference pvVar5;
  reference pvVar6;
  long lVar7;
  DataChunk *pDVar8;
  size_type sVar9;
  long lVar10;
  
  if (this->rhs->count == 0) {
    OVar4 = FINISHED;
  }
  else {
    bVar3 = NextValue(this,input,output);
    if (bVar3) {
      pDVar8 = input;
      if (this->scan_input_chunk != false) {
        pDVar8 = &this->scan_chunk;
      }
      pVVar1 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (this->scan_input_chunk == true) {
        lVar7 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      }
      else {
        lVar7 = 0;
      }
      output->count = pDVar8->count;
      if (pVVar2 != pVVar1) {
        lVar10 = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
        sVar9 = 0;
        do {
          pvVar5 = vector<duckdb::Vector,_true>::operator[](&output->data,lVar7 + sVar9);
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,sVar9);
          Vector::Reference(pvVar5,pvVar6);
          sVar9 = sVar9 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != sVar9);
      }
      bVar3 = this->scan_input_chunk == false;
      pDVar8 = &this->scan_chunk;
      if (!bVar3) {
        pDVar8 = input;
      }
      pVVar1 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar2 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (bVar3) {
        lVar7 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      }
      else {
        lVar7 = 0;
      }
      OVar4 = HAVE_MORE_OUTPUT;
      if (pVVar2 != pVVar1) {
        lVar10 = ((long)pVVar2 - (long)pVVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
        sVar9 = 0;
        do {
          pvVar5 = vector<duckdb::Vector,_true>::operator[](&output->data,lVar7 + sVar9);
          pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar8->data,sVar9);
          ConstantVector::Reference(pvVar5,pvVar6,this->position_in_chunk,pDVar8->count);
          sVar9 = sVar9 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != sVar9);
        OVar4 = HAVE_MORE_OUTPUT;
      }
    }
    else {
      this->initialized = false;
      OVar4 = NEED_MORE_INPUT;
    }
  }
  return OVar4;
}

Assistant:

OperatorResultType CrossProductExecutor::Execute(DataChunk &input, DataChunk &output) {
	if (rhs.Count() == 0) {
		// no RHS: empty result
		return OperatorResultType::FINISHED;
	}
	if (!NextValue(input, output)) {
		// ran out of entries on the RHS
		// reset the RHS and move to the next chunk on the LHS
		initialized = false;
		return OperatorResultType::NEED_MORE_INPUT;
	}

	// set up the constant chunk
	auto &constant_chunk = scan_input_chunk ? scan_chunk : input;
	auto col_count = constant_chunk.ColumnCount();
	auto col_offset = scan_input_chunk ? input.ColumnCount() : 0;
	output.SetCardinality(constant_chunk.size());
	for (idx_t i = 0; i < col_count; i++) {
		output.data[col_offset + i].Reference(constant_chunk.data[i]);
	}

	// for the chunk that we are scanning, scan a single value from that chunk
	auto &scan = scan_input_chunk ? input : scan_chunk;
	col_count = scan.ColumnCount();
	col_offset = scan_input_chunk ? 0 : input.ColumnCount();
	for (idx_t i = 0; i < col_count; i++) {
		ConstantVector::Reference(output.data[col_offset + i], scan.data[i], position_in_chunk, scan.size());
	}
	return OperatorResultType::HAVE_MORE_OUTPUT;
}